

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O3

void test_dashes(Am_Drawonable *d)

{
  int iVar1;
  undefined1 *puVar2;
  long lVar3;
  Am_Style aAStack_78 [8];
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style dash3;
  Am_Style dash2;
  Am_Style dash1;
  Am_Style no_dash;
  Am_Image_Array local_38 [8];
  Am_Image_Array local_30 [8];
  Am_Image_Array local_28 [8];
  Am_Image_Array local_20 [8];
  
  Am_Image_Array::Am_Image_Array(local_20,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&no_dash,4,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,local_20);
  Am_Image_Array::~Am_Image_Array(local_20);
  Am_Image_Array::Am_Image_Array(local_28,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&dash1,4,1,0,1,&Am_DEFAULT_DASH_LIST,2,0,0,local_28);
  Am_Image_Array::~Am_Image_Array(local_28);
  Am_Image_Array::Am_Image_Array(local_30,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&dash2,4,1,0,1,test_dashes::dash2_list,6,0,0,local_30);
  Am_Image_Array::~Am_Image_Array(local_30);
  Am_Image_Array::Am_Image_Array(local_38,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&dash3,4,1,0,1,test_dashes::dash3_list,2,0,0,local_38);
  Am_Image_Array::~Am_Image_Array(local_38);
  Am_Style::Am_Style(local_60,&no_dash);
  Am_Style::Am_Style(local_68,&dash1);
  Am_Style::Am_Style(local_70,&dash2);
  Am_Style::Am_Style(aAStack_78,&dash3);
  set_style_array(local_60,local_68,local_70,aAStack_78);
  Am_Style::~Am_Style(aAStack_78);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  lVar3 = -0x50;
  puVar2 = style_array;
  do {
    iVar1 = (int)lVar3 + 100;
    (**(code **)(*(long *)d + 0x140))(d,puVar2,iVar1,0xa0,iVar1,300,0);
    puVar2 = puVar2 + 8;
    lVar3 = lVar3 + 0x14;
  } while (lVar3 != 0);
  Am_Style::~Am_Style(&dash3);
  Am_Style::~Am_Style(&dash2);
  Am_Style::~Am_Style(&dash1);
  Am_Style::~Am_Style(&no_dash);
  return;
}

Assistant:

void
test_dashes(Am_Drawonable *d)
{
  int n, x;

  const int dash2_list_length = 6;
  static char dash2_list[dash2_list_length] = {3, 3, 3, 3, 9, 3};
  const int dash3_list_length = 2;
  static char dash3_list[dash3_list_length] = {16, 16};
  Am_Style no_dash(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                   Am_LINE_SOLID);
  Am_Style dash1(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH);
  Am_Style dash2(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, dash2_list, dash2_list_length);
  Am_Style dash3(0.0f, 0.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, dash3_list, dash3_list_length);

  set_style_array(no_dash, dash1, dash2, dash3);
  for (n = 0; n <= 3; n++) {
    x = 20 + (20 * n);
    d->Draw_Line(style_array[n], x, 160, x, 300);
  }
}